

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  uv__signal_tree_s uVar4;
  uv_signal_s *puVar5;
  int iVar6;
  uv_signal_t *puVar7;
  uv_signal_s *puVar8;
  uv_signal_s *puVar9;
  uv_signal_s *puVar10;
  uv_signal_s *puVar11;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar12;
  uv__signal_tree_s *puVar13;
  uv__signal_tree_s uVar14;
  sigset_t saved_sigmask;
  sigset_t sStack_a8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                  ,0x14e,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    return -0x16;
  }
  if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }
  uv__signal_block_and_lock(&sStack_a8);
  puVar7 = uv__signal_first_handle(signum);
  if (puVar7 == (uv_signal_t *)0x0) {
    iVar6 = uv__signal_register_handler(signum,oneshot);
    if (iVar6 != 0) {
LAB_0011f333:
      uv__signal_unlock_and_unblock(&sStack_a8);
      return iVar6;
    }
    handle->signum = signum;
    if (oneshot == 0) goto LAB_0011f346;
  }
  else {
    if (oneshot == 0) {
      if (((puVar7->flags & 0x2000000) != 0) &&
         (iVar6 = uv__signal_register_handler(signum,0), iVar6 != 0)) goto LAB_0011f333;
      handle->signum = signum;
      goto LAB_0011f346;
    }
    handle->signum = signum;
  }
  pbVar1 = (byte *)((long)&handle->flags + 3);
  *pbVar1 = *pbVar1 | 2;
LAB_0011f346:
  uVar14.rbh_root = uv__signal_tree.rbh_root;
  uVar4.rbh_root = uv__signal_tree.rbh_root;
  if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_parent = (uv_signal_s *)0x0;
    puVar13 = &uv__signal_tree;
    uVar14.rbh_root = handle;
  }
  else {
    do {
      while( true ) {
        puVar7 = uVar4.rbh_root;
        iVar6 = uv__signal_compare(handle,puVar7);
        if (iVar6 < 0) break;
        if (iVar6 == 0) goto LAB_0011f5a2;
        uVar4.rbh_root = (puVar7->tree_entry).rbe_right;
        if (uVar4.rbh_root == (uv_signal_s *)0x0) {
          (handle->tree_entry).rbe_parent = puVar7;
          puVar13 = (uv__signal_tree_s *)&(puVar7->tree_entry).rbe_right;
          goto LAB_0011f3ae;
        }
      }
      uVar4.rbh_root = (puVar7->tree_entry).rbe_left;
    } while (uVar4.rbh_root != (uv_signal_s *)0x0);
    (handle->tree_entry).rbe_parent = puVar7;
    puVar13 = (uv__signal_tree_s *)&puVar7->tree_entry;
LAB_0011f3ae:
    (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
    (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
  }
  (handle->tree_entry).rbe_color = 1;
  ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar13)->rbe_left = handle;
  puVar10 = (handle->tree_entry).rbe_parent;
  puVar5 = handle;
  do {
    if ((puVar10 == (uv_signal_s *)0x0) ||
       (uVar14.rbh_root = uv__signal_tree.rbh_root, (puVar10->tree_entry).rbe_color != 1)) {
      ((uVar14.rbh_root)->tree_entry).rbe_color = 0;
LAB_0011f5a2:
      uv__signal_unlock_and_unblock(&sStack_a8);
      handle->signal_cb = signal_cb;
      uVar3 = handle->flags;
      if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
        puVar2 = &handle->loop->active_handles;
        *puVar2 = *puVar2 + 1;
      }
      return 0;
    }
    puVar9 = (puVar10->tree_entry).rbe_parent;
    puVar11 = (puVar9->tree_entry).rbe_left;
    puVar8 = puVar5;
    if (puVar10 == puVar11) {
      puVar11 = (puVar9->tree_entry).rbe_right;
      if ((puVar11 != (uv_signal_s *)0x0) && ((puVar11->tree_entry).rbe_color == 1))
      goto LAB_0011f41f;
      puVar11 = (puVar10->tree_entry).rbe_right;
      if (puVar11 == puVar5) {
        puVar8 = (puVar11->tree_entry).rbe_left;
        (puVar10->tree_entry).rbe_right = puVar8;
        if (puVar8 == (uv_signal_s *)0x0) {
          (puVar11->tree_entry).rbe_parent = puVar9;
          puVar8 = (puVar10->tree_entry).rbe_parent;
LAB_0011f515:
          puVar13 = (uv__signal_tree_s *)&(puVar8->tree_entry).rbe_right;
          if (puVar10 == (puVar8->tree_entry).rbe_left) {
            puVar13 = (uv__signal_tree_s *)&puVar8->tree_entry;
          }
        }
        else {
          (puVar8->tree_entry).rbe_parent = puVar10;
          puVar8 = (puVar10->tree_entry).rbe_parent;
          (puVar11->tree_entry).rbe_parent = puVar8;
          puVar13 = &uv__signal_tree;
          if (puVar8 != (uv_signal_s *)0x0) goto LAB_0011f515;
        }
        ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar13)->rbe_left = puVar11;
        (puVar11->tree_entry).rbe_left = puVar10;
        (puVar10->tree_entry).rbe_parent = puVar11;
        puVar8 = puVar10;
        puVar10 = puVar5;
      }
      (puVar10->tree_entry).rbe_color = 0;
      (puVar9->tree_entry).rbe_color = 1;
      puVar10 = (puVar9->tree_entry).rbe_left;
      puVar5 = (puVar10->tree_entry).rbe_right;
      (puVar9->tree_entry).rbe_left = puVar5;
      if (puVar5 != (uv_signal_s *)0x0) {
        (puVar5->tree_entry).rbe_parent = puVar9;
      }
      puVar5 = (puVar9->tree_entry).rbe_parent;
      (puVar10->tree_entry).rbe_parent = puVar5;
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar5 != (uv_signal_s *)0x0) {
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar5->tree_entry).rbe_right;
        if (puVar9 == (puVar5->tree_entry).rbe_left) {
          paVar12 = &puVar5->tree_entry;
        }
      }
      paVar12->rbe_left = puVar10;
      (puVar10->tree_entry).rbe_right = puVar9;
LAB_0011f57e:
      (puVar9->tree_entry).rbe_parent = puVar10;
      puVar9 = puVar8;
    }
    else {
      if ((puVar11 == (uv_signal_s *)0x0) || ((puVar11->tree_entry).rbe_color != 1)) {
        puVar11 = (puVar10->tree_entry).rbe_left;
        if (puVar11 == puVar5) {
          puVar8 = (puVar11->tree_entry).rbe_right;
          (puVar10->tree_entry).rbe_left = puVar8;
          if (puVar8 == (uv_signal_s *)0x0) {
            (puVar11->tree_entry).rbe_parent = puVar9;
            puVar8 = (puVar10->tree_entry).rbe_parent;
LAB_0011f4a2:
            puVar13 = (uv__signal_tree_s *)&(puVar8->tree_entry).rbe_right;
            if (puVar10 == (puVar8->tree_entry).rbe_left) {
              puVar13 = (uv__signal_tree_s *)&puVar8->tree_entry;
            }
          }
          else {
            (puVar8->tree_entry).rbe_parent = puVar10;
            puVar8 = (puVar10->tree_entry).rbe_parent;
            (puVar11->tree_entry).rbe_parent = puVar8;
            puVar13 = &uv__signal_tree;
            if (puVar8 != (uv_signal_s *)0x0) goto LAB_0011f4a2;
          }
          ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar13)->rbe_left = puVar11;
          (puVar11->tree_entry).rbe_right = puVar10;
          (puVar10->tree_entry).rbe_parent = puVar11;
          puVar8 = puVar10;
          puVar10 = puVar5;
        }
        (puVar10->tree_entry).rbe_color = 0;
        (puVar9->tree_entry).rbe_color = 1;
        puVar10 = (puVar9->tree_entry).rbe_right;
        puVar5 = (puVar10->tree_entry).rbe_left;
        (puVar9->tree_entry).rbe_right = puVar5;
        if (puVar5 != (uv_signal_s *)0x0) {
          (puVar5->tree_entry).rbe_parent = puVar9;
        }
        puVar5 = (puVar9->tree_entry).rbe_parent;
        (puVar10->tree_entry).rbe_parent = puVar5;
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        if (puVar5 != (uv_signal_s *)0x0) {
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar5->tree_entry).rbe_right;
          if (puVar9 == (puVar5->tree_entry).rbe_left) {
            paVar12 = &puVar5->tree_entry;
          }
        }
        paVar12->rbe_left = puVar10;
        (puVar10->tree_entry).rbe_left = puVar9;
        goto LAB_0011f57e;
      }
LAB_0011f41f:
      (puVar11->tree_entry).rbe_color = 0;
      (puVar10->tree_entry).rbe_color = 0;
      (puVar9->tree_entry).rbe_color = 1;
    }
    puVar10 = (puVar9->tree_entry).rbe_parent;
    puVar5 = puVar9;
    uVar14.rbh_root = uv__signal_tree.rbh_root;
  } while( true );
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}